

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_state
duckdb_execute_prepared(duckdb_prepared_statement prepared_statement,duckdb_result *out_result)

{
  bool bVar1;
  duckdb_state dVar2;
  pointer pPVar3;
  long in_RDI;
  case_insensitive_map_t<BoundParameterData> *unaff_retaddr;
  PreparedStatement *in_stack_00000008;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  PreparedStatementWrapper *wrapper;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
  *in_stack_ffffffffffffff98;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffffc;
  undefined1 allow_stream_result;
  
  allow_stream_result = (undefined1)((uint)in_stack_fffffffffffffffc >> 0x18);
  if ((in_RDI != 0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                          *)0x1916bbe), bVar1)) {
    pPVar3 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->(in_stack_ffffffffffffffa0);
    bVar1 = duckdb::PreparedStatement::HasError(pPVar3);
    if (!bVar1) {
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                 0x1916bf7);
      pPVar3 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->(in_stack_ffffffffffffffa0);
      duckdb::PreparedStatement::Execute(in_stack_00000008,unaff_retaddr,(bool)allow_stream_result);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      operator=((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x1916c3d);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                 &stack0xffffffffffffffb8,in_stack_ffffffffffffff98);
      dVar2 = duckdb::DuckDBTranslateResult
                        ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)in_stack_ffffffffffffffb8._M_head_impl,(duckdb_result *)pPVar3);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x1916cbb);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x1916ce9);
      return dVar2;
    }
  }
  return DuckDBError;
}

Assistant:

duckdb_state duckdb_execute_prepared(duckdb_prepared_statement prepared_statement, duckdb_result *out_result) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}

	duckdb::unique_ptr<duckdb::QueryResult> result;
	try {
		result = wrapper->statement->Execute(wrapper->values, false);
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBTranslateResult(std::move(result), out_result);
}